

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

void __thiscall ki::dml::Field<int>::~Field(Field<int> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR___cxa_pure_virtual_0015cc00;
  pcVar2 = (this->super_FieldBase).m_name._M_dataplus._M_p;
  paVar1 = &(this->super_FieldBase).m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~Field() = default;